

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_get_attribute_count(exr_const_context_t ctxt,int part_index,int32_t *count)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (count != (int32_t *)0x0) {
      *count = *(int32_t *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
      return 0;
    }
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,3);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

exr_result_t
exr_get_attribute_count (
    exr_const_context_t ctxt, int part_index, int32_t* count)
{
    int32_t cnt;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    cnt = part->attributes.num_attributes;
    EXR_UNLOCK_WRITE (pctxt);

    if (!count) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);
    *count = cnt;
    return EXR_ERR_SUCCESS;
}